

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_circle3d(rf_vec3 center,float radius,rf_vec3 rotation_axis,float rotationAngle,
                     rf_color color)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= prVar3[lVar2].v_counter + 0x48) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_58 = center.x;
  fStack_54 = center.y;
  rf_gfx_translatef(local_58,fStack_54,center.z);
  local_48 = rotation_axis.x;
  fStack_44 = rotation_axis.y;
  rf_gfx_rotatef(rotationAngle,local_48,fStack_44,rotation_axis.z);
  rf_gfx_begin(RF_LINES);
  uVar4 = 0;
  do {
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    fVar6 = sinf((float)(long)uVar4 * 0.017453292);
    fVar7 = cosf((float)(long)uVar4 * 0.017453292);
    rf_gfx_vertex3f(fVar6 * radius,fVar7 * radius,0.0);
    fVar6 = (float)(long)(uVar4 + 10) * 0.017453292;
    fVar7 = sinf(fVar6);
    fVar6 = cosf(fVar6);
    rf_gfx_vertex3f(fVar7 * radius,fVar6 * radius,0.0);
    bVar5 = uVar4 < 0x15e;
    uVar4 = uVar4 + 10;
  } while (bVar5);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_circle3d(rf_vec3 center, float radius, rf_vec3 rotation_axis, float rotationAngle, rf_color color)
{
    if (rf_gfx_check_buffer_limit(2 * 36)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(center.x, center.y, center.z);
    rf_gfx_rotatef(rotationAngle, rotation_axis.x, rotation_axis.y, rotation_axis.z);

    rf_gfx_begin(RF_LINES);
    for (rf_int i = 0; i < 360; i += 10)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius, cosf(RF_DEG2RAD*i)*radius, 0.0f);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 10))*radius, cosf(RF_DEG2RAD*(i + 10))*radius, 0.0f);
    }
    rf_gfx_end();
    rf_gfx_pop_matrix();
}